

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                    (string_view str,uint8_t *target)

{
  uint t;
  size_type sVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  uint8_t *puVar3;
  uint8_t *in_RCX;
  string_view str_00;
  LogMessage local_48;
  Voidify local_35;
  uint local_34;
  unsigned_long local_30;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint8_t *target_local;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  target_local = (uint8_t *)str._M_len;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)target;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&target_local);
  local_30 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar1);
  t = std::numeric_limits<unsigned_int>::max();
  local_34 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  local_28 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_int>
                       (&local_30,&local_34,"str.size() <= std::numeric_limits<uint32_t>::max()");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x401,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_35,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&target_local);
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)
       WriteVarint32ToArray((uint32_t)sVar1,(uint8_t *)absl_log_internal_check_op_result);
  str_00._M_str = absl_log_internal_check_op_result;
  str_00._M_len = str_local._M_len;
  puVar3 = WriteStringToArray((CodedOutputStream *)target_local,str_00,in_RCX);
  return puVar3;
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(absl::string_view str,
                                                       uint8_t* target) {
  ABSL_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}